

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcore_desktop_glfw.c
# Opt level: O1

void SetWindowIcons(Image *images,int count)

{
  GLFWimage *images_00;
  long lVar1;
  int count_00;
  
  if (images == (Image *)0x0 || count < 1) {
    glfwSetWindowIcon(platform.handle,0,(GLFWimage *)0x0);
    return;
  }
  images_00 = (GLFWimage *)calloc((ulong)(uint)count,0x10);
  lVar1 = 0;
  count_00 = 0;
  do {
    if (*(int *)((long)&images->format + lVar1) == 7) {
      images_00[count_00].width = *(int *)((long)&images->width + lVar1);
      images_00[count_00].height = *(int *)((long)&images->height + lVar1);
      images_00[count_00].pixels = *(uchar **)((long)&images->data + lVar1);
      count_00 = count_00 + 1;
    }
    else {
      TraceLog(4,"GLFW: Window icon image must be in R8G8B8A8 pixel format");
    }
    lVar1 = lVar1 + 0x18;
  } while ((ulong)(uint)count * 0x18 != lVar1);
  glfwSetWindowIcon(platform.handle,count_00,images_00);
  free(images_00);
  return;
}

Assistant:

void SetWindowIcons(Image *images, int count)
{
    if ((images == NULL) || (count <= 0))
    {
        // Revert to the default window icon, pass in an empty image array
        glfwSetWindowIcon(platform.handle, 0, NULL);
    }
    else
    {
        int valid = 0;
        GLFWimage *icons = RL_CALLOC(count, sizeof(GLFWimage));

        for (int i = 0; i < count; i++)
        {
            if (images[i].format == PIXELFORMAT_UNCOMPRESSED_R8G8B8A8)
            {
                icons[valid].width = images[i].width;
                icons[valid].height = images[i].height;
                icons[valid].pixels = (unsigned char *)images[i].data;

                valid++;
            }
            else TRACELOG(LOG_WARNING, "GLFW: Window icon image must be in R8G8B8A8 pixel format");
        }
        // NOTE: Images data is copied internally before this function returns
        glfwSetWindowIcon(platform.handle, valid, icons);

        RL_FREE(icons);
    }
}